

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

int32 ngram_model_set_add_ug(ngram_model_t *base,int32 wid,int32 lweight)

{
  ngram_model_t *model;
  char *word;
  int32 iVar1;
  void *pvVar2;
  float64 fVar3;
  int32 local_40;
  int32 local_3c;
  int32 n_hist;
  int32 wprob;
  int32 prob;
  int32 i;
  int32 *newwid;
  ngram_model_set_t *set;
  int32 lweight_local;
  int32 wid_local;
  ngram_model_t *base_local;
  
  newwid = &base->refcount;
  set._0_4_ = lweight;
  set._4_4_ = wid;
  _lweight_local = base;
  _prob = __ckd_calloc__((long)base[1].refcount,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                         ,0x31a);
  n_hist = _lweight_local->log_zero;
  wprob = 0;
  do {
    if (newwid[0x18] <= wprob) {
      pvVar2 = __ckd_realloc__(*(void **)(newwid + 0x20),(long)_lweight_local->n_words << 3,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                               ,0x341);
      *(void **)(newwid + 0x20) = pvVar2;
      pvVar2 = __ckd_realloc__((void *)**(undefined8 **)(newwid + 0x20),
                               (long)(_lweight_local->n_words * newwid[0x18]) << 2,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                               ,0x344);
      **(undefined8 **)(newwid + 0x20) = pvVar2;
      for (wprob = 0; wprob < _lweight_local->n_words; wprob = wprob + 1) {
        *(long *)(*(long *)(newwid + 0x20) + (long)wprob * 8) =
             **(long **)(newwid + 0x20) + (long)(wprob * newwid[0x18]) * 4;
      }
      memcpy(*(void **)(*(long *)(newwid + 0x20) + (long)set._4_4_ * 8),_prob,
             (long)newwid[0x18] << 2);
      ckd_free(_prob);
      return n_hist;
    }
    if ((newwid[0x19] == -1) || (newwid[0x19] == wprob)) {
      iVar1 = ngram_wid(*(ngram_model_t **)(*(long *)(newwid + 0x1a) + (long)wprob * 8),
                        _lweight_local->word_str[set._4_4_]);
      *(int32 *)((long)_prob + (long)wprob * 4) = iVar1;
      if (*(int *)((long)_prob + (long)wprob * 4) == -1) {
        model = *(ngram_model_t **)(*(long *)(newwid + 0x1a) + (long)wprob * 8);
        word = _lweight_local->word_str[set._4_4_];
        fVar3 = logmath_exp(_lweight_local->lmath,(int32)set);
        iVar1 = ngram_model_add_word(model,word,(float32)(float)(double)fVar3);
        *(int32 *)((long)_prob + (long)wprob * 4) = iVar1;
        if (*(int *)((long)_prob + (long)wprob * 4) == -1) {
          ckd_free(_prob);
          return _lweight_local->log_zero;
        }
      }
      local_3c = ngram_ng_prob(*(ngram_model_t **)(*(long *)(newwid + 0x1a) + (long)wprob * 8),
                               *(int32 *)((long)_prob + (long)wprob * 4),(int32 *)0x0,0,&local_40);
      iVar1 = local_3c;
      if ((newwid[0x19] != wprob) && (iVar1 = n_hist, newwid[0x19] == -1)) {
        iVar1 = logmath_add(_lweight_local->lmath,n_hist,
                            *(int *)(*(long *)(newwid + 0x1e) + (long)wprob * 4) + local_3c);
      }
    }
    else {
      *(undefined4 *)((long)_prob + (long)wprob * 4) = 0xffffffff;
      iVar1 = n_hist;
    }
    n_hist = iVar1;
    wprob = wprob + 1;
  } while( true );
}

Assistant:

static int32
ngram_model_set_add_ug(ngram_model_t * base, int32 wid, int32 lweight)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 *newwid;
    int32 i, prob;

    /* At this point the word has already been added to the master
       model and we have a new word ID for it.  Add it to active
       submodels and track the word IDs. */
    newwid = ckd_calloc(set->n_models, sizeof(*newwid));
    prob = base->log_zero;
    for (i = 0; i < set->n_models; ++i) {
        int32 wprob, n_hist;

        /* Only add to active models. */
        if (set->cur == -1 || set->cur == i) {
            /* Did this word already exist? */
            newwid[i] = ngram_wid(set->lms[i], base->word_str[wid]);
            if (newwid[i] == NGRAM_INVALID_WID) {
                /* Add it to the submodel. */
                newwid[i] =
                    ngram_model_add_word(set->lms[i], base->word_str[wid],
                                         (float32) logmath_exp(base->lmath,
                                                               lweight));
                if (newwid[i] == NGRAM_INVALID_WID) {
                    ckd_free(newwid);
                    return base->log_zero;
                }
            }
            /* Now get the unigram probability for the new word and either
             * interpolate it or use it (if this is the current model). */
            wprob =
                ngram_ng_prob(set->lms[i], newwid[i], NULL, 0, &n_hist);
            if (set->cur == i)
                prob = wprob;
            else if (set->cur == -1)
                prob =
                    logmath_add(base->lmath, prob,
                                set->lweights[i] + wprob);
        }
        else {
            newwid[i] = NGRAM_INVALID_WID;
        }
    }
    /* Okay we have the word IDs for this in all the submodels.  Now
       do some complicated memory mangling to add this to the
       widmap. */
    set->widmap =
        ckd_realloc(set->widmap, base->n_words * sizeof(*set->widmap));
    set->widmap[0] =
        ckd_realloc(set->widmap[0],
                    base->n_words * set->n_models * sizeof(**set->widmap));
    for (i = 0; i < base->n_words; ++i)
        set->widmap[i] = set->widmap[0] + i * set->n_models;
    memcpy(set->widmap[wid], newwid, set->n_models * sizeof(*newwid));
    ckd_free(newwid);
    return prob;
}